

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

uint get_max_prime(uint number)

{
  uint uVar1;
  uint uVar2;
  uint i;
  uint uVar3;
  int j;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = number;
  while (uVar3 = uVar2, uVar2 = (uint)(number != 0), 1 < uVar3) {
    uVar5 = 2;
    while ((uVar2 = uVar3 - 1, (uint)uVar5 < uVar3 && ((int)((ulong)uVar3 % uVar5) != 0))) {
      uVar4 = (uint)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      uVar2 = uVar3;
      if (uVar3 == uVar4) goto LAB_0010369a;
    }
  }
LAB_0010369a:
  uVar1 = 2;
  if (2 < uVar2) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

uint get_max_prime(unsigned int number) {
    for (unsigned int i = number; i >= 2; --i) {
        for (int j = 2; j < i; ++j) {
            if (i % j == 0)
                break;
            if (j == i - 1)
                return i;
        }
    }
    return 2;
}